

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O3

void __thiscall ODDLParser::Value::dump(Value *this,IOStreamBase *param_1)

{
  uchar *__s;
  int16 iVar1;
  int32 iVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  float v;
  double v_1;
  uchar local_15;
  float local_14;
  double local_10;
  
  switch(this->m_type) {
  case ddl_bool:
    poVar4 = std::ostream::_M_insert<bool>(true);
    break;
  case ddl_int8:
    local_15 = *this->m_data;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)&local_15,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    return;
  case ddl_int16:
    iVar1 = getInt16(this);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar1);
    break;
  case ddl_int32:
    iVar2 = getInt32(this);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
    break;
  case ddl_int64:
    getInt64(this);
    poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
    break;
  case ddl_unsigned_int8:
  case ddl_unsigned_int16:
  case ddl_unsigned_int32:
  case ddl_unsigned_int64:
  case ddl_half:
  case ddl_ref:
    pcVar6 = "Not supported";
    lVar5 = 0xd;
LAB_00671cd7:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
LAB_00671cdf:
    poVar4 = (ostream *)&std::cout;
    lVar5 = std::cout;
    goto LAB_00671e25;
  case ddl_float:
    memcpy(&local_14,this->m_data,this->m_size);
    goto LAB_00671dfd;
  case ddl_double:
    memcpy(&local_10,this->m_data,this->m_size);
    local_14 = (float)local_10;
LAB_00671dfd:
    poVar4 = std::ostream::_M_insert<double>((double)local_14);
    break;
  case ddl_string:
    __s = this->m_data;
    if (__s == (uchar *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x8e0318);
    }
    else {
      sVar3 = strlen((char *)__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar3);
    }
    goto LAB_00671cdf;
  case ddl_none:
    pcVar6 = "None";
    lVar5 = 4;
    goto LAB_00671cd7;
  default:
    return;
  }
  lVar5 = *(long *)poVar4;
LAB_00671e25:
  std::ios::widen((char)*(undefined8 *)(lVar5 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void Value::dump( IOStreamBase &/*stream*/ ) {
    switch( m_type ) {
        case ddl_none:
            std::cout << "None" << std::endl;
            break;
        case ddl_bool:
            std::cout << getBool() << std::endl;
            break;
        case ddl_int8:
            std::cout << getInt8() << std::endl;
            break;
        case ddl_int16:
            std::cout << getInt16() << std::endl;
            break;
        case ddl_int32:
            std::cout << getInt32() << std::endl;
            break;
        case ddl_int64:
            std::cout << getInt64() << std::endl;
            break;
        case ddl_unsigned_int8:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_unsigned_int16:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_unsigned_int32:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_unsigned_int64:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_half:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_float:
            std::cout << getFloat() << std::endl;
            break;
        case ddl_double:
            std::cout << getDouble() << std::endl;
            break;
        case ddl_string:
            std::cout << getString() << std::endl;
            break;
        case ddl_ref:
            std::cout << "Not supported" << std::endl;
            break;
        default:
            break;
    }
}